

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model_dict.hpp
# Opt level: O2

void __thiscall
cimod::
BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
::remove_interaction
          (BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dict>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_u,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_v)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  __node_base *p_Var5;
  __node_base *p_Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> u;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  
  pbVar2 = std::min<std::__cxx11::string>(arg_u,arg_v);
  std::__cxx11::string::string((string *)&local_80,(string *)pbVar2);
  pbVar2 = std::max<std::__cxx11::string>(arg_u,arg_v);
  std::__cxx11::string::string((string *)&local_a0,(string *)pbVar2);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_60,&local_80,&local_a0);
  sVar3 = std::
          _Hashtable<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::count(&(this->m_quadratic)._M_h,&local_60);
  if (sVar3 != 0) {
    std::
    _Hashtable<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase(&(this->m_quadratic)._M_h,&local_60);
  }
  p_Var6 = &(this->m_quadratic)._M_h._M_before_begin;
  p_Var5 = p_Var6;
  while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (p_Var5 + 1),&local_80);
    if ((_Var1) ||
       (_Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(p_Var5 + 5),&local_80), _Var1)) goto LAB_00164f85;
  }
  pmVar4 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this,&local_80);
  if ((*pmVar4 == 0.0) && (!NAN(*pmVar4))) {
    remove_variable(this,&local_80);
  }
LAB_00164f85:
  do {
    p_Var6 = p_Var6->_M_nxt;
    if (p_Var6 == (__node_base *)0x0) {
      pmVar4 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this,&local_a0);
      if ((*pmVar4 == 0.0) && (!NAN(*pmVar4))) {
        remove_variable(this,&local_a0);
      }
LAB_00164fdd:
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_60);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_80);
      return;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (p_Var6 + 1),&local_a0);
    if ((_Var1) ||
       (_Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(p_Var6 + 5),&local_a0), _Var1)) goto LAB_00164fdd;
  } while( true );
}

Assistant:

void remove_interaction( const IndexType &arg_u, const IndexType &arg_v ) {
      IndexType u = std::min( arg_u, arg_v );
      IndexType v = std::max( arg_u, arg_v );
      auto p = std::make_pair( u, v );
      if ( m_quadratic.count( p ) != 0 ) {
        m_quadratic.erase( p );
      }

      bool u_flag = true;
      for ( auto &it : m_quadratic ) {
        if ( ( it.first.first == u ) || ( it.first.second == u ) ) {
          u_flag = false;
          break;
        }
      }

      if ( u_flag && ( m_linear[ u ] == 0 ) ) {
        remove_variable( u );
      }

      bool v_flag = true;
      for ( auto &it : m_quadratic ) {
        if ( ( it.first.first == v ) || ( it.first.second == v ) ) {
          v_flag = false;
          break;
        }
      }

      if ( v_flag && ( m_linear[ v ] == 0 ) ) {
        remove_variable( v );
      }
    }